

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashxo::Hash64(char *s,size_t len)

{
  ulong in_RSI;
  char *in_RDI;
  char *in_stack_00000010;
  size_t in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  size_t in_stack_00000110;
  char *in_stack_00000118;
  undefined8 local_8;
  
  if (in_RSI < 0x21) {
    if (in_RSI < 0x11) {
      local_8 = farmhashna::HashLen0to16(in_stack_00000038,(size_t)in_stack_00000030);
    }
    else {
      local_8 = farmhashna::HashLen17to32(in_stack_00000030,in_stack_00000028);
    }
  }
  else if (in_RSI < 0x41) {
    local_8 = HashLen33to64(in_stack_00000010,(size_t)s);
  }
  else if (in_RSI < 0x61) {
    local_8 = HashLen65to96(in_stack_00000010,(size_t)s);
  }
  else if (in_RSI < 0x101) {
    local_8 = farmhashna::Hash64(in_stack_00000118,in_stack_00000110);
  }
  else {
    local_8 = farmhashuo::Hash64(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhashna::HashLen0to16(s, len);
    } else {
      return farmhashna::HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  } else if (len <= 96) {
    return HashLen65to96(s, len);
  } else if (len <= 256) {
    return farmhashna::Hash64(s, len);
  } else {
    return farmhashuo::Hash64(s, len);
  }
}